

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_resetCCtx_internal
                 (ZSTD_CCtx *zc,ZSTD_CCtx_params *params,U64 pledgedSrcSize,size_t loadedDictSize,
                 ZSTD_compResetPolicy_e crp,ZSTD_buffered_policy_e zbuff)

{
  ldmParams_t *params_00;
  ZSTD_compressionParameters *cParams;
  int *piVar1;
  ZSTD_cwksp *ws;
  ZSTD_paramSwitch_e ZVar2;
  int useSequenceProducer;
  void *pvVar3;
  ZSTD_allocFunction p_Var4;
  bool bVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ZSTD_freeFunction p_Var10;
  ZSTD_customMem customMem;
  ZSTD_compressionParameters cParams_00;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined1 auVar14 [12];
  uint uVar15;
  uint uVar16;
  ZSTD_strategy ZVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  size_t sVar22;
  ulong bytes;
  size_t sVar23;
  size_t sVar24;
  seqDef *psVar25;
  ldmEntry_t *__s;
  rawSeq *prVar26;
  ZSTD_Sequence *pZVar27;
  BYTE *pBVar28;
  ulong uVar29;
  void *pvVar30;
  ZSTD_compressedBlockState_t *pZVar31;
  U32 *pUVar32;
  size_t err_code;
  size_t sVar33;
  ZSTD_indexResetPolicy_e forceResetIndex;
  U64 UVar34;
  ulong local_88;
  undefined4 local_6c;
  undefined4 uStack_68;
  
  uVar6 = (params->cParams).searchLog;
  uVar11 = (params->cParams).windowLog;
  uVar12 = (params->cParams).chainLog;
  uVar13 = (params->cParams).hashLog;
  cParams_00.hashLog = uVar13;
  cParams_00.chainLog = uVar12;
  cParams_00.windowLog = uVar11;
  uVar7 = (params->cParams).minMatch;
  uVar8 = (params->cParams).targetLength;
  uVar9 = (params->cParams).strategy;
  cParams_00.searchLog = uVar6;
  cParams_00.minMatch = uVar7;
  cParams_00.targetLength = uVar8;
  cParams_00.strategy = uVar9;
  sVar22 = ZSTD_checkCParams(cParams_00);
  if (0xffffffffffffff88 < sVar22) {
    __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params->cParams))",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x58bf,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  zc->isFirstBlock = 1;
  memcpy(&zc->appliedParams,params,0xd0);
  if ((zc->appliedParams).useRowMatchFinder == ZSTD_ps_auto) {
    __assert_fail("params->useRowMatchFinder != ZSTD_ps_auto",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x58c9,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  if ((zc->appliedParams).useBlockSplitter == ZSTD_ps_auto) {
    __assert_fail("params->useBlockSplitter != ZSTD_ps_auto",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x58ca,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  ZVar2 = (zc->appliedParams).ldmParams.enableLdm;
  if (ZVar2 == ZSTD_ps_auto) {
    __assert_fail("params->ldmParams.enableLdm != ZSTD_ps_auto",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x58cb,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  sVar22 = (zc->appliedParams).maxBlockSize;
  if (sVar22 == 0) {
    __assert_fail("params->maxBlockSize != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x58cc,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  params_00 = &(zc->appliedParams).ldmParams;
  if (ZVar2 == ZSTD_ps_enable) {
    ZSTD_ldm_adjustParameters(params_00,&(zc->appliedParams).cParams);
    if ((zc->appliedParams).ldmParams.hashLog < (zc->appliedParams).ldmParams.bucketSizeLog) {
      __assert_fail("params->ldmParams.hashLog >= params->ldmParams.bucketSizeLog",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x58d0,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    if (0x1f < (zc->appliedParams).ldmParams.hashRateLog) {
      __assert_fail("params->ldmParams.hashRateLog < 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x58d1,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    sVar22 = (zc->appliedParams).maxBlockSize;
  }
  UVar34 = 1L << ((byte)(zc->appliedParams).cParams.windowLog & 0x3f);
  if (pledgedSrcSize <= UVar34) {
    UVar34 = pledgedSrcSize;
  }
  if (pledgedSrcSize == 0) {
    UVar34 = 1;
  }
  uVar29 = UVar34;
  if (sVar22 < UVar34) {
    uVar29 = sVar22;
  }
  useSequenceProducer = (zc->appliedParams).useSequenceProducer;
  sVar23 = 0;
  bytes = uVar29 / (4 - (ulong)(useSequenceProducer != 0 ||
                               (zc->appliedParams).cParams.minMatch == 3));
  sVar33 = 0;
  if (zbuff == ZSTDb_buffered) {
    if ((zc->appliedParams).outBufferMode == ZSTD_bm_buffered) {
      sVar23 = ZSTD_compressBound(uVar29);
      sVar23 = sVar23 + 1;
    }
    else {
      sVar23 = 0;
    }
    sVar33 = 0;
    if ((zc->appliedParams).inBufferMode == ZSTD_bm_buffered) {
      sVar33 = UVar34 + uVar29;
    }
  }
  if (params_00->enableLdm == ZSTD_ps_enable) {
    local_88 = uVar29 / (zc->appliedParams).ldmParams.minMatchLength;
  }
  else {
    local_88 = 0;
  }
  cParams = &(zc->appliedParams).cParams;
  forceResetIndex = ZSTDirp_reset;
  if ((loadedDictSize < 0x20000000) &&
     ((ulong)((long)(zc->blockState).matchState.window.nextSrc -
             (long)(zc->blockState).matchState.window.base) < 0xdf000001)) {
    forceResetIndex = (ZSTD_indexResetPolicy_e)(zc->initialized == 0);
  }
  sVar22 = ZSTD_estimateCCtxSize_usingCCtxParams_internal
                     (cParams,params_00,(uint)(zc->staticSize != 0),
                      (zc->appliedParams).useRowMatchFinder,sVar33,sVar23,pledgedSrcSize,
                      useSequenceProducer,sVar22);
  if (0xffffffffffffff88 < sVar22) {
    return sVar22;
  }
  sVar24 = zc->staticSize;
  if (sVar24 == 0) {
    piVar1 = &(zc->workspace).workspaceOversizedDuration;
    *piVar1 = *piVar1 + 1;
  }
  pvVar30 = (zc->workspace).workspace;
  if ((ulong)((long)(zc->workspace).allocStart - (long)(zc->workspace).tableEnd) < sVar22 * 3) {
    bVar5 = false;
  }
  else {
    bVar5 = 0x80 < (zc->workspace).workspaceOversizedDuration;
  }
  ws = &zc->workspace;
  if (((ulong)((long)(zc->workspace).workspaceEnd - (long)pvVar30) < sVar22) || (bVar5)) {
    if (sVar24 != 0) {
      return 0xffffffffffffffc0;
    }
    pvVar3 = (zc->customMem).opaque;
    p_Var10 = (zc->customMem).customFree;
    auVar14 = *(undefined1 (*) [12])&zc->customMem;
    (zc->workspace).initOnceStart = (void *)0x0;
    (zc->workspace).allocFailed = '\0';
    *(undefined3 *)&(zc->workspace).field_0x39 = 0;
    (zc->workspace).workspaceOversizedDuration = 0;
    (zc->workspace).tableValidEnd = (void *)0x0;
    (zc->workspace).allocStart = (void *)0x0;
    (zc->workspace).objectEnd = (void *)0x0;
    (zc->workspace).tableEnd = (void *)0x0;
    ws->workspace = (void *)0x0;
    (zc->workspace).workspaceEnd = (void *)0x0;
    (zc->workspace).phase = ZSTD_cwksp_alloc_objects;
    (zc->workspace).isStatic = ZSTD_cwksp_dynamic_alloc;
    customMem.customFree._4_4_ = (int)((ulong)p_Var10 >> 0x20);
    customMem._0_12_ = auVar14;
    customMem.opaque._0_4_ = (int)pvVar3;
    customMem.opaque._4_4_ = (int)((ulong)pvVar3 >> 0x20);
    ZSTD_customFree(pvVar30,customMem);
    p_Var4 = (zc->customMem).customAlloc;
    if (p_Var4 == (ZSTD_allocFunction)0x0) {
      pvVar30 = malloc(sVar22);
    }
    else {
      pvVar30 = (*p_Var4)((zc->customMem).opaque,sVar22);
    }
    if (pvVar30 == (void *)0x0) {
      return 0xffffffffffffffc0;
    }
    ZSTD_cwksp_init(ws,pvVar30,sVar22,ZSTD_cwksp_dynamic_alloc);
    if ((ulong)((long)(zc->workspace).allocStart - (long)(zc->workspace).tableEnd) < 0x2c00) {
      __assert_fail("ZSTD_cwksp_check_available(ws, 2 * sizeof(ZSTD_compressedBlockState_t))",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5905,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    pZVar31 = (ZSTD_compressedBlockState_t *)ZSTD_cwksp_reserve_object(ws,0x1600);
    (zc->blockState).prevCBlock = pZVar31;
    if (pZVar31 == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
    pZVar31 = (ZSTD_compressedBlockState_t *)ZSTD_cwksp_reserve_object(ws,0x1600);
    (zc->blockState).nextCBlock = pZVar31;
    if (pZVar31 == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
    pUVar32 = (U32 *)ZSTD_cwksp_reserve_object(ws,0x22d8);
    zc->entropyWorkspace = pUVar32;
    if (pUVar32 == (U32 *)0x0) {
      return 0xffffffffffffffc0;
    }
    forceResetIndex = ZSTDirp_reset;
  }
  ZSTD_cwksp_clear(ws);
  uVar18 = cParams->windowLog;
  uVar19 = cParams->chainLog;
  uVar20 = (zc->appliedParams).cParams.hashLog;
  uVar21 = (zc->appliedParams).cParams.searchLog;
  uVar15 = (zc->appliedParams).cParams.minMatch;
  uVar16 = (zc->appliedParams).cParams.targetLength;
  ZVar17 = (zc->appliedParams).cParams.strategy;
  (zc->blockState).matchState.cParams.searchLog = (zc->appliedParams).cParams.searchLog;
  (zc->blockState).matchState.cParams.minMatch = uVar15;
  (zc->blockState).matchState.cParams.targetLength = uVar16;
  (zc->blockState).matchState.cParams.strategy = ZVar17;
  (zc->blockState).matchState.cParams.windowLog = uVar18;
  (zc->blockState).matchState.cParams.chainLog = uVar19;
  (zc->blockState).matchState.cParams.hashLog = uVar20;
  (zc->blockState).matchState.cParams.searchLog = uVar21;
  (zc->blockState).matchState.prefetchCDictTables =
       (uint)((zc->appliedParams).prefetchCDictTables == ZSTD_ps_enable);
  zc->pledgedSrcSizePlusOne = pledgedSrcSize + 1;
  zc->consumedSrcSize = 0;
  zc->producedCSize = 0;
  if (pledgedSrcSize + 1 == 0) {
    (zc->appliedParams).fParams.contentSizeFlag = 0;
  }
  zc->blockSize = uVar29;
  (zc->xxhState).total_len = 0;
  (zc->xxhState).v[0] = 0;
  (zc->xxhState).v[1] = 0;
  (zc->xxhState).v[2] = 0;
  (zc->xxhState).v[3] = 0;
  (zc->xxhState).mem64[0] = 0;
  (zc->xxhState).mem64[1] = 0;
  (zc->xxhState).mem64[2] = 0;
  (zc->xxhState).reserved64 = 0;
  (zc->xxhState).mem64[3] = 0;
  (zc->xxhState).memsize = 0;
  (zc->xxhState).reserved32 = 0;
  (zc->xxhState).v[0] = 0x60ea27eeadc0b5d6;
  (zc->xxhState).v[1] = 0xc2b2ae3d27d4eb4f;
  (zc->xxhState).v[3] = 0x61c8864e7a143579;
  zc->stage = ZSTDcs_init;
  zc->dictID = 0;
  zc->dictContentSize = 0;
  ZSTD_reset_compressedBlockState((zc->blockState).prevCBlock);
  sVar24 = ZSTD_reset_matchState
                     (&(zc->blockState).matchState,ws,cParams,(zc->appliedParams).useRowMatchFinder,
                      crp,forceResetIndex,ZSTD_resetTarget_CCtx);
  if (sVar24 < 0xffffffffffffff89) {
    psVar25 = (seqDef *)ZSTD_cwksp_reserve_aligned(ws,bytes * 8);
    (zc->seqStore).sequencesStart = psVar25;
    if ((zc->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
      sVar24 = 8L << ((byte)(zc->appliedParams).ldmParams.hashLog & 0x3f);
      __s = (ldmEntry_t *)ZSTD_cwksp_reserve_aligned(ws,sVar24);
      (zc->ldmState).hashTable = __s;
      memset(__s,0,sVar24);
      prVar26 = (rawSeq *)ZSTD_cwksp_reserve_aligned(ws,local_88 * 0xc);
      zc->ldmSequences = prVar26;
      zc->maxNbLdmSequences = local_88;
      *(undefined8 *)&(zc->ldmState).window.nbOverflowCorrections = 0;
      (zc->ldmState).window.base = " ";
      (zc->ldmState).window.dictBase = " ";
      (zc->ldmState).window.dictLimit = 2;
      (zc->ldmState).window.lowLimit = 2;
      (zc->ldmState).window.nextSrc = (BYTE *)"BC7 709 Luma:            ";
      (zc->ldmState).loadedDictEnd = 0;
    }
    if ((zc->appliedParams).useSequenceProducer != 0) {
      sVar24 = uVar29 / 3 + 1;
      (zc->externalMatchCtx).seqBufferCapacity = sVar24;
      pZVar27 = (ZSTD_Sequence *)ZSTD_cwksp_reserve_aligned(ws,sVar24 * 0x10);
      (zc->externalMatchCtx).seqBuffer = pZVar27;
    }
    pBVar28 = ZSTD_cwksp_reserve_buffer(ws,uVar29 + 0x20);
    (zc->seqStore).litStart = pBVar28;
    (zc->seqStore).maxNbLit = uVar29;
    zc->bufferedPolicy = zbuff;
    zc->inBuffSize = sVar33;
    pBVar28 = ZSTD_cwksp_reserve_buffer(ws,sVar33);
    zc->inBuff = (char *)pBVar28;
    zc->outBuffSize = sVar23;
    pBVar28 = ZSTD_cwksp_reserve_buffer(ws,sVar23);
    zc->outBuff = (char *)pBVar28;
    if ((zc->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
      sVar33 = 1L << ((char)(zc->appliedParams).ldmParams.hashLog -
                      (char)(zc->appliedParams).ldmParams.bucketSizeLog & 0x3fU);
      pBVar28 = ZSTD_cwksp_reserve_buffer(ws,sVar33);
      (zc->ldmState).bucketOffsets = pBVar28;
      memset(pBVar28,0,sVar33);
    }
    ZSTD_referenceExternalSequences(zc,(rawSeq *)0x0,0);
    (zc->seqStore).maxNbSeq = bytes;
    pBVar28 = ZSTD_cwksp_reserve_buffer(ws,bytes);
    (zc->seqStore).llCode = pBVar28;
    pBVar28 = ZSTD_cwksp_reserve_buffer(ws,bytes);
    (zc->seqStore).mlCode = pBVar28;
    pBVar28 = ZSTD_cwksp_reserve_buffer(ws,bytes);
    (zc->seqStore).ofCode = pBVar28;
    uVar29 = ((long)(zc->workspace).tableEnd + (long)(zc->workspace).workspaceEnd) -
             ((long)(zc->workspace).workspace + (long)(zc->workspace).allocStart);
    if ((uVar29 < sVar22 - 0x80) || (sVar22 < uVar29)) {
      __assert_fail("ZSTD_cwksp_estimated_space_within_bounds(ws, neededSpace)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5963,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    zc->initialized = 1;
    sVar24 = 0;
  }
  return sVar24;
}

Assistant:

static size_t ZSTD_resetCCtx_internal(ZSTD_CCtx* zc,
                                      ZSTD_CCtx_params const* params,
                                      U64 const pledgedSrcSize,
                                      size_t const loadedDictSize,
                                      ZSTD_compResetPolicy_e const crp,
                                      ZSTD_buffered_policy_e const zbuff)
{
    ZSTD_cwksp* const ws = &zc->workspace;
    DEBUGLOG(4, "ZSTD_resetCCtx_internal: pledgedSrcSize=%u, wlog=%u, useRowMatchFinder=%d useBlockSplitter=%d",
                (U32)pledgedSrcSize, params->cParams.windowLog, (int)params->useRowMatchFinder, (int)params->useBlockSplitter);
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));

    zc->isFirstBlock = 1;

    /* Set applied params early so we can modify them for LDM,
     * and point params at the applied params.
     */
    zc->appliedParams = *params;
    params = &zc->appliedParams;

    assert(params->useRowMatchFinder != ZSTD_ps_auto);
    assert(params->useBlockSplitter != ZSTD_ps_auto);
    assert(params->ldmParams.enableLdm != ZSTD_ps_auto);
    assert(params->maxBlockSize != 0);
    if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
        /* Adjust long distance matching parameters */
        ZSTD_ldm_adjustParameters(&zc->appliedParams.ldmParams, &params->cParams);
        assert(params->ldmParams.hashLog >= params->ldmParams.bucketSizeLog);
        assert(params->ldmParams.hashRateLog < 32);
    }

    {   size_t const windowSize = MAX(1, (size_t)MIN(((U64)1 << params->cParams.windowLog), pledgedSrcSize));
        size_t const blockSize = MIN(params->maxBlockSize, windowSize);
        size_t const maxNbSeq = ZSTD_maxNbSeq(blockSize, params->cParams.minMatch, params->useSequenceProducer);
        size_t const buffOutSize = (zbuff == ZSTDb_buffered && params->outBufferMode == ZSTD_bm_buffered)
                ? ZSTD_compressBound(blockSize) + 1
                : 0;
        size_t const buffInSize = (zbuff == ZSTDb_buffered && params->inBufferMode == ZSTD_bm_buffered)
                ? windowSize + blockSize
                : 0;
        size_t const maxNbLdmSeq = ZSTD_ldm_getMaxNbSeq(params->ldmParams, blockSize);

        int const indexTooClose = ZSTD_indexTooCloseToMax(zc->blockState.matchState.window);
        int const dictTooBig = ZSTD_dictTooBig(loadedDictSize);
        ZSTD_indexResetPolicy_e needsIndexReset =
            (indexTooClose || dictTooBig || !zc->initialized) ? ZSTDirp_reset : ZSTDirp_continue;

        size_t const neededSpace =
            ZSTD_estimateCCtxSize_usingCCtxParams_internal(
                &params->cParams, &params->ldmParams, zc->staticSize != 0, params->useRowMatchFinder,
                buffInSize, buffOutSize, pledgedSrcSize, params->useSequenceProducer, params->maxBlockSize);
        int resizeWorkspace;

        FORWARD_IF_ERROR(neededSpace, "cctx size estimate failed!");

        if (!zc->staticSize) ZSTD_cwksp_bump_oversized_duration(ws, 0);

        {   /* Check if workspace is large enough, alloc a new one if needed */
            int const workspaceTooSmall = ZSTD_cwksp_sizeof(ws) < neededSpace;
            int const workspaceWasteful = ZSTD_cwksp_check_wasteful(ws, neededSpace);
            resizeWorkspace = workspaceTooSmall || workspaceWasteful;
            DEBUGLOG(4, "Need %zu B workspace", neededSpace);
            DEBUGLOG(4, "windowSize: %zu - blockSize: %zu", windowSize, blockSize);

            if (resizeWorkspace) {
                DEBUGLOG(4, "Resize workspaceSize from %zuKB to %zuKB",
                            ZSTD_cwksp_sizeof(ws) >> 10,
                            neededSpace >> 10);

                RETURN_ERROR_IF(zc->staticSize, memory_allocation, "static cctx : no resize");

                needsIndexReset = ZSTDirp_reset;

                ZSTD_cwksp_free(ws, zc->customMem);
                FORWARD_IF_ERROR(ZSTD_cwksp_create(ws, neededSpace, zc->customMem), "");

                DEBUGLOG(5, "reserving object space");
                /* Statically sized space.
                 * entropyWorkspace never moves,
                 * though prev/next block swap places */
                assert(ZSTD_cwksp_check_available(ws, 2 * sizeof(ZSTD_compressedBlockState_t)));
                zc->blockState.prevCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.prevCBlock == NULL, memory_allocation, "couldn't allocate prevCBlock");
                zc->blockState.nextCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.nextCBlock == NULL, memory_allocation, "couldn't allocate nextCBlock");
                zc->entropyWorkspace = (U32*) ZSTD_cwksp_reserve_object(ws, ENTROPY_WORKSPACE_SIZE);
                RETURN_ERROR_IF(zc->entropyWorkspace == NULL, memory_allocation, "couldn't allocate entropyWorkspace");
        }   }

        ZSTD_cwksp_clear(ws);

        /* init params */
        zc->blockState.matchState.cParams = params->cParams;
        zc->blockState.matchState.prefetchCDictTables = params->prefetchCDictTables == ZSTD_ps_enable;
        zc->pledgedSrcSizePlusOne = pledgedSrcSize+1;
        zc->consumedSrcSize = 0;
        zc->producedCSize = 0;
        if (pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN)
            zc->appliedParams.fParams.contentSizeFlag = 0;
        DEBUGLOG(4, "pledged content size : %u ; flag : %u",
            (unsigned)pledgedSrcSize, zc->appliedParams.fParams.contentSizeFlag);
        zc->blockSize = blockSize;

        XXH64_reset(&zc->xxhState, 0);
        zc->stage = ZSTDcs_init;
        zc->dictID = 0;
        zc->dictContentSize = 0;

        ZSTD_reset_compressedBlockState(zc->blockState.prevCBlock);

        FORWARD_IF_ERROR(ZSTD_reset_matchState(
                &zc->blockState.matchState,
                ws,
                &params->cParams,
                params->useRowMatchFinder,
                crp,
                needsIndexReset,
                ZSTD_resetTarget_CCtx), "");

        zc->seqStore.sequencesStart = (seqDef*)ZSTD_cwksp_reserve_aligned(ws, maxNbSeq * sizeof(seqDef));

        /* ldm hash table */
        if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
            /* TODO: avoid memset? */
            size_t const ldmHSize = ((size_t)1) << params->ldmParams.hashLog;
            zc->ldmState.hashTable = (ldmEntry_t*)ZSTD_cwksp_reserve_aligned(ws, ldmHSize * sizeof(ldmEntry_t));
            ZSTD_memset(zc->ldmState.hashTable, 0, ldmHSize * sizeof(ldmEntry_t));
            zc->ldmSequences = (rawSeq*)ZSTD_cwksp_reserve_aligned(ws, maxNbLdmSeq * sizeof(rawSeq));
            zc->maxNbLdmSequences = maxNbLdmSeq;

            ZSTD_window_init(&zc->ldmState.window);
            zc->ldmState.loadedDictEnd = 0;
        }

        /* reserve space for block-level external sequences */
        if (params->useSequenceProducer) {
            size_t const maxNbExternalSeq = ZSTD_sequenceBound(blockSize);
            zc->externalMatchCtx.seqBufferCapacity = maxNbExternalSeq;
            zc->externalMatchCtx.seqBuffer =
                (ZSTD_Sequence*)ZSTD_cwksp_reserve_aligned(ws, maxNbExternalSeq * sizeof(ZSTD_Sequence));
        }

        /* buffers */

        /* ZSTD_wildcopy() is used to copy into the literals buffer,
         * so we have to oversize the buffer by WILDCOPY_OVERLENGTH bytes.
         */
        zc->seqStore.litStart = ZSTD_cwksp_reserve_buffer(ws, blockSize + WILDCOPY_OVERLENGTH);
        zc->seqStore.maxNbLit = blockSize;

        zc->bufferedPolicy = zbuff;
        zc->inBuffSize = buffInSize;
        zc->inBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffInSize);
        zc->outBuffSize = buffOutSize;
        zc->outBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffOutSize);

        /* ldm bucketOffsets table */
        if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
            /* TODO: avoid memset? */
            size_t const numBuckets =
                  ((size_t)1) << (params->ldmParams.hashLog -
                                  params->ldmParams.bucketSizeLog);
            zc->ldmState.bucketOffsets = ZSTD_cwksp_reserve_buffer(ws, numBuckets);
            ZSTD_memset(zc->ldmState.bucketOffsets, 0, numBuckets);
        }

        /* sequences storage */
        ZSTD_referenceExternalSequences(zc, NULL, 0);
        zc->seqStore.maxNbSeq = maxNbSeq;
        zc->seqStore.llCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.mlCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.ofCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));

        DEBUGLOG(3, "wksp: finished allocating, %zd bytes remain available", ZSTD_cwksp_available_space(ws));
        assert(ZSTD_cwksp_estimated_space_within_bounds(ws, neededSpace));

        zc->initialized = 1;

        return 0;
    }
}